

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshifter.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1565df::PshifterState::update
          (PshifterState *this,ALCcontext *param_2,EffectSlot *slot,EffectProps *props,
          EffectTarget target)

{
  float fVar1;
  span<float,_16UL> *this_00;
  int *in_RCX;
  float (*in_RDI) [3];
  element_type_conflict2 (*in_R8) [16];
  undefined8 in_XMM1_Qa;
  array<float,_16UL> coeffs;
  float pitch;
  int tune;
  float in_stack_ffffffffffffff4c;
  float in_stack_ffffffffffffff8c;
  float *in_stack_ffffffffffffff90;
  MixParams *in_stack_ffffffffffffff98;
  span<float,_16UL> in_stack_ffffffffffffffa0;
  
  std::pow(5.30498947741318e-315,
           (double)CONCAT44((int)((ulong)in_XMM1_Qa >> 0x20),
                            (float)(*in_RCX * 100 + in_RCX[1]) / 1200.0));
  fVar1 = (float)fastf2u(0.0);
  in_RDI[3][1] = fVar1;
  *(double *)in_RDI[4] = (double)(uint)in_RDI[3][1] * 0.000244140625;
  CalcDirectionCoeffs(in_RDI,in_stack_ffffffffffffff4c);
  *(undefined8 *)(in_RDI[1] + 1) = *(undefined8 *)in_R8[2];
  *(undefined8 *)in_RDI[2] = *(undefined8 *)(in_R8[2] + 2);
  this_00 = (span<float,_16UL> *)std::array<float,_16UL>::data((array<float,_16UL> *)0x1dddf1);
  al::span<float,_16UL>::span(this_00,in_R8);
  ComputePanGains(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,
                  in_stack_ffffffffffffffa0);
  return;
}

Assistant:

void PshifterState::update(const ALCcontext*, const EffectSlot *slot,
    const EffectProps *props, const EffectTarget target)
{
    const int tune{props->Pshifter.CoarseTune*100 + props->Pshifter.FineTune};
    const float pitch{std::pow(2.0f, static_cast<float>(tune) / 1200.0f)};
    mPitchShiftI = fastf2u(pitch*MixerFracOne);
    mPitchShift  = mPitchShiftI * double{1.0/MixerFracOne};

    const auto coeffs = CalcDirectionCoeffs({0.0f, 0.0f, -1.0f}, 0.0f);

    mOutTarget = target.Main->Buffer;
    ComputePanGains(target.Main, coeffs.data(), slot->Gain, mTargetGains);
}